

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compare.hpp
# Opt level: O2

int boost::unit_test::ut_detail::case_ins<const_char>::compare(char *s1,char *s2,size_t n)

{
  bool bVar1;
  size_t i;
  size_t sVar2;
  
  sVar2 = 0;
  while( true ) {
    if (n == sVar2) {
      return 0;
    }
    bVar1 = eq(s1[sVar2],s2[sVar2]);
    if (!bVar1) break;
    sVar2 = sVar2 + 1;
  }
  bVar1 = lt(s1[sVar2],s2[sVar2]);
  return -(uint)bVar1 | 1;
}

Assistant:

static int          compare( CharT const* s1, CharT const* s2, std::size_t n )
    {
        for( std::size_t i = 0; i < n; ++i ) {
            if( !eq( s1[i], s2[i] ) )
                return lt( s1[i], s2[i] ) ? -1 : 1;
        }
        return 0;
    }